

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlistwidget.cpp
# Opt level: O0

char * __thiscall QListModel::index(QListModel *this,char *__s,int __c)

{
  ulong uVar1;
  uint in_ECX;
  QListModel *pQVar2;
  
  pQVar2 = this;
  uVar1 = QAbstractItemModel::hasIndex((int)__s,__c,(QModelIndex *)(ulong)in_ECX);
  if ((uVar1 & 1) == 0) {
    QModelIndex::QModelIndex((QModelIndex *)0x89a42d);
  }
  else {
    QList<QListWidgetItem_*>::at((QList<QListWidgetItem_*> *)this,CONCAT44(in_ECX,__c));
    QAbstractItemModel::createIndex
              ((QAbstractItemModel *)__s,(int)((ulong)pQVar2 >> 0x20),(int)pQVar2,this);
  }
  return (char *)pQVar2;
}

Assistant:

QModelIndex QListModel::index(int row, int column, const QModelIndex &parent) const
{
    if (hasIndex(row, column, parent))
        return createIndex(row, column, items.at(row));
    return QModelIndex();
}